

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,QColor>>::emplace<std::pair<double,QColor>const&>
          (QMovableArrayOps<std::pair<double,QColor>> *this,qsizetype i,pair<double,_QColor> *args)

{
  undefined4 *puVar1;
  double dVar2;
  undefined8 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  ushort uVar6;
  Spec SVar7;
  long lVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  qsizetype qVar12;
  long in_FS_OFFSET;
  undefined4 local_78;
  undefined4 uStack_74;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this == (int *)0x0) || (1 < **(int **)this)) goto LAB_003232db;
  if (*(long *)(this + 0x10) == i) {
    qVar12 = QArrayDataPointer<std::pair<double,_QColor>_>::freeSpaceAtEnd
                       ((QArrayDataPointer<std::pair<double,_QColor>_> *)this);
    if (qVar12 == 0) goto LAB_003232d2;
    lVar8 = *(long *)(this + 0x10);
    lVar9 = *(long *)(this + 8);
    *(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18) = *(undefined8 *)((long)&(args->second).ct + 4);
    uVar10 = *(undefined4 *)((long)&args->first + 4);
    SVar7 = (args->second).cspec;
    uVar11 = *(undefined4 *)&(args->second).ct;
    puVar1 = (undefined4 *)(lVar9 + lVar8 * 0x18);
    *puVar1 = *(undefined4 *)&args->first;
    puVar1[1] = uVar10;
    puVar1[2] = SVar7;
    puVar1[3] = uVar11;
  }
  else {
LAB_003232d2:
    if (i == 0) {
      qVar12 = QArrayDataPointer<std::pair<double,_QColor>_>::freeSpaceAtBegin
                         ((QArrayDataPointer<std::pair<double,_QColor>_> *)this);
      if (qVar12 == 0) goto LAB_003232db;
      lVar8 = *(long *)(this + 8);
      *(undefined8 *)(lVar8 + -8) = *(undefined8 *)((long)&(args->second).ct + 4);
      uVar10 = *(undefined4 *)((long)&args->first + 4);
      SVar7 = (args->second).cspec;
      uVar11 = *(undefined4 *)&(args->second).ct;
      *(undefined4 *)(lVar8 + -0x18) = *(undefined4 *)&args->first;
      *(undefined4 *)(lVar8 + -0x14) = uVar10;
      *(Spec *)(lVar8 + -0x10) = SVar7;
      *(undefined4 *)(lVar8 + -0xc) = uVar11;
    }
    else {
LAB_003232db:
      dVar2 = args->first;
      SVar7 = (args->second).cspec;
      uVar3 = *(undefined8 *)&(args->second).ct;
      uVar6 = (args->second).ct.argb.pad;
      uVar4 = (args->second).field_0xe;
      uVar5 = (args->second).field_0xf;
      lVar8 = *(long *)(this + 0x10);
      QArrayDataPointer<std::pair<double,_QColor>_>::detachAndGrow
                ((QArrayDataPointer<std::pair<double,_QColor>_> *)this,(uint)(i == 0 && lVar8 != 0),
                 1,(pair<double,_QColor> **)0x0,(QArrayDataPointer<std::pair<double,_QColor>_> *)0x0
                );
      local_78 = (undefined4)uVar3;
      uStack_74 = (undefined4)((ulong)uVar3 >> 0x20);
      if (i != 0 || lVar8 == 0) {
        QMovableArrayOps<std::pair<double,_QColor>_>::Inserter::Inserter
                  (&local_60,(QArrayDataPointer<std::pair<double,_QColor>_> *)this,i,1);
        (local_60.displaceFrom)->first = dVar2;
        ((local_60.displaceFrom)->second).cspec = SVar7;
        *(undefined4 *)&((local_60.displaceFrom)->second).ct = local_78;
        *(undefined4 *)((long)&((local_60.displaceFrom)->second).ct + 4) = uStack_74;
        ((local_60.displaceFrom)->second).ct.argb.pad = uVar6;
        ((local_60.displaceFrom)->second).field_0xe = uVar4;
        ((local_60.displaceFrom)->second).field_0xf = uVar5;
        (local_60.data)->size = (local_60.data)->size + local_60.nInserts;
        goto LAB_003233b7;
      }
      lVar8 = *(long *)(this + 8);
      *(double *)(lVar8 + -0x18) = dVar2;
      *(Spec *)(lVar8 + -0x10) = SVar7;
      *(undefined4 *)(lVar8 + -0xc) = local_78;
      *(undefined4 *)(lVar8 + -8) = uStack_74;
      *(ushort *)(lVar8 + -4) = uVar6;
      *(undefined1 *)(lVar8 + -2) = uVar4;
      *(undefined1 *)(lVar8 + -1) = uVar5;
    }
    *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
  }
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
LAB_003233b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }